

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

void __thiscall
front::symbol::ArraySymbol::ArraySymbol
          (ArraySymbol *this,string *name,SharedSyPtr *item,int layer_num,bool is_const,
          bool is_param)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR___cxa_pure_virtual_001efa58;
  (this->super_Symbol)._name._M_dataplus._M_p = (pointer)&(this->super_Symbol)._name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Symbol)._name,local_50,local_48 + (long)local_50);
  (this->super_Symbol)._layerNum = layer_num;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001efba0;
  (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (item->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (item->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->_is_const = is_const;
  this->_is_param = is_param;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_size = -1;
  iVar3 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar3;
  return;
}

Assistant:

ArraySymbol(string name, SharedSyPtr item, int layer_num, bool is_const,
              bool is_param)
      : _item(item), _is_const(is_const), _is_param(is_param),
        Symbol(name, layer_num) {
    _size = -1;
    id = Symbol::symbolId++;
  }